

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O0

ion_err_t lfb_put(ion_lfb_t *bag,ion_byte_t *to_write,uint num_bytes,ion_file_offset_t next,
                 ion_file_offset_t *wrote_at)

{
  ion_err_t iVar1;
  ion_file_offset_t iVar2;
  undefined8 uStack_40;
  ion_err_t error;
  ion_file_offset_t next_empty;
  ion_file_offset_t *wrote_at_local;
  ion_file_offset_t next_local;
  ion_byte_t *piStack_20;
  uint num_bytes_local;
  ion_byte_t *to_write_local;
  ion_lfb_t *bag_local;
  
  uStack_40 = 0xffffffffffffffff;
  next_empty = (ion_file_offset_t)wrote_at;
  wrote_at_local = (ion_file_offset_t *)next;
  next_local._4_4_ = num_bytes;
  piStack_20 = to_write;
  to_write_local = (ion_byte_t *)bag;
  if (bag->next_empty == -1) {
    iVar2 = ion_fend(bag->file_handle);
    *(ion_file_offset_t *)next_empty = iVar2;
  }
  else {
    iVar1 = ion_fread_at(bag->file_handle,bag->next_empty,8,(ion_byte_t *)&stack0xffffffffffffffc0);
    if (iVar1 != '\0') {
      return iVar1;
    }
    *(undefined8 *)next_empty = *(undefined8 *)(to_write_local + 8);
  }
  bag_local._7_1_ =
       ion_fwrite_at(*(ion_file_handle_t *)to_write_local,*(ion_file_offset_t *)next_empty,8,
                     (ion_byte_t *)&wrote_at_local);
  if ((bag_local._7_1_ == '\0') &&
     (bag_local._7_1_ =
           ion_fwrite_at(*(ion_file_handle_t *)to_write_local,*(long *)next_empty + 8,
                         next_local._4_4_,piStack_20), bag_local._7_1_ == '\0')) {
    *(undefined8 *)(to_write_local + 8) = uStack_40;
    bag_local._7_1_ = '\0';
  }
  return bag_local._7_1_;
}

Assistant:

ion_err_t
lfb_put(
	ion_lfb_t			*bag,
	ion_byte_t			*to_write,
	unsigned int		num_bytes,
	ion_file_offset_t	next,
	ion_file_offset_t	*wrote_at
) {
	ion_file_offset_t	next_empty;
	ion_err_t			error;

	next_empty = ION_LFB_NULL;

	if (ION_LFB_NULL != bag->next_empty) {
		error = ion_fread_at(bag->file_handle, bag->next_empty, sizeof(ion_file_offset_t), (ion_byte_t *) &next_empty);

		if (err_ok != error) {
			return error;
		}

		*wrote_at = bag->next_empty;
	}
	else {
		*wrote_at = ion_fend(bag->file_handle);
	}

	error = ion_fwrite_at(bag->file_handle, *wrote_at, sizeof(ion_file_offset_t), (ion_byte_t *) &next);

	if (err_ok != error) {
		return error;
	}

	error = ion_fwrite_at(bag->file_handle, *wrote_at + sizeof(ion_file_offset_t), num_bytes, to_write);

	if (err_ok != error) {
		return error;
	}

	bag->next_empty = next_empty;

	return err_ok;
}